

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

ssize_t libssh2_channel_read_ex(LIBSSH2_CHANNEL *channel,int stream_id,char *buf,size_t buflen)

{
  int iVar1;
  unsigned_long uVar2;
  time_t tVar3;
  time_t entry_time_1;
  time_t entry_time;
  unsigned_long recv_window;
  ssize_t rc;
  size_t buflen_local;
  char *buf_local;
  int stream_id_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local = (LIBSSH2_CHANNEL *)0xffffffffffffffd9;
  }
  else {
    uVar2 = libssh2_channel_window_read_ex(channel,(unsigned_long *)0x0,(unsigned_long *)0x0);
    if (uVar2 < buflen) {
      tVar3 = time((time_t *)0x0);
      do {
        iVar1 = _libssh2_channel_receive_window_adjust(channel,(uint32_t)buflen,'\x01',(uint *)0x0);
        if ((iVar1 != -0x25) || (channel->session->api_block_mode == 0)) break;
        iVar1 = _libssh2_wait_socket(channel->session,tVar3);
      } while (iVar1 == 0);
    }
    tVar3 = time((time_t *)0x0);
    do {
      recv_window = _libssh2_channel_read(channel,stream_id,buf,buflen);
      if ((recv_window != 0xffffffffffffffdb) || (channel->session->api_block_mode == 0)) break;
      iVar1 = _libssh2_wait_socket(channel->session,tVar3);
      recv_window = (unsigned_long)iVar1;
    } while (recv_window == 0);
    channel_local = (LIBSSH2_CHANNEL *)recv_window;
  }
  return (ssize_t)channel_local;
}

Assistant:

LIBSSH2_API ssize_t
libssh2_channel_read_ex(LIBSSH2_CHANNEL *channel, int stream_id, char *buf,
                        size_t buflen)
{
    ssize_t rc;
    unsigned long recv_window;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    recv_window = libssh2_channel_window_read_ex(channel, NULL, NULL);

    if(buflen > recv_window) {
        BLOCK_ADJUST(rc, channel->session,
                     _libssh2_channel_receive_window_adjust(channel,
                                                   (uint32_t)buflen, 1, NULL));
    }

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_read(channel, stream_id, buf, buflen));
    return rc;
}